

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.cpp
# Opt level: O1

void __thiscall
qclab::qgates::CRotationZ<std::complex<float>_>::apply
          (CRotationZ<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  RotationZ<std::complex<float>_> *pRVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_24_3_f49331b9 f;
  int *local_60 [2];
  long local_50;
  undefined1 local_48 [16];
  undefined4 local_38;
  float local_34;
  
  (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
    super_QObject<std::complex<float>_>._vptr_QObject[5])(local_60,this);
  *local_60[0] = *local_60[0] + offset;
  local_60[0][1] = local_60[0][1] + offset;
  iVar1 = (this->super_QControlledGate2<std::complex<float>_>).control_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[0xf])(this);
  pRVar2 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_false>.
           _M_head_impl;
  local_48._8_4_ = (pRVar2->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_;
  local_48._12_4_ = (pRVar2->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_;
  local_48._0_8_ =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_34 = -(float)local_48._12_4_;
  if (op != ConjTrans) {
    local_34 = (float)local_48._12_4_;
    local_48._12_4_ = -(float)local_48._12_4_;
  }
  local_38 = local_48._8_4_;
  apply4<qclab::qgates::lambda_RotationZ<std::complex<float>,float>(qclab::Op,float,float,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_60[0],local_60[0][1],iVar1 + offset,iVar3 + offset,
             (this->super_QControlledGate2<std::complex<float>_>).controlState_,
             (anon_class_24_3_f49331b9 *)local_48);
  if (local_60[0] != (int *)0x0) {
    operator_delete(local_60[0],local_50 - (long)local_60[0]);
  }
  return;
}

Assistant:

void CRotationZ< T >::apply( Op op , const int nbQubits ,
                               std::vector< T >& vector ,
                               const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_RotationZ( op , this->cos() , this->sin() , vector.data() );
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }